

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

void __thiscall gui::TextBox::handleMousePress(TextBox *this,Button button,Vector2f *mouseParent)

{
  float fVar1;
  element_type *peVar2;
  Text *pTVar3;
  Vector2f *pVVar4;
  size_t in_RDX;
  int in_ESI;
  Vector2<float> *in_RDI;
  float fVar5;
  Vector2f VVar6;
  Vector2f VVar7;
  float distance;
  size_t i;
  float closestDistance;
  size_t closestIndex;
  Vector2f mouseLocal;
  String *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Widget *in_stack_ffffffffffffff98;
  Text *pTVar8;
  Widget *in_stack_ffffffffffffffa0;
  Transformable *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Text *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  Text *this_01;
  float local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  Widget::handleMousePress
            (in_stack_ffffffffffffffa0,(Button)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (Vector2f *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  VVar6 = Widget::toLocalOriginSpace
                    (in_stack_ffffffffffffff98,
                     (Vector2f *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (in_ESI < 3) {
    Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
              ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (Widget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI);
  }
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (Widget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (Button)((ulong)in_RDI >> 0x20),
             (Vector2<float> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x28ed5d);
  sf::Text::setString((Text *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
  peVar2 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x28ed89);
  this_00 = &(peVar2->text_).super_Transformable;
  peVar2 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x28eda9);
  fVar5 = (peVar2->textPadding_).x;
  peVar2 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x28edc8);
  sf::Transformable::setPosition(this_00,fVar5,(peVar2->textPadding_).y);
  this_01 = (Text *)0x0;
  fVar5 = std::numeric_limits<float>::max();
  local_38 = (Text *)0x0;
  while( true ) {
    pTVar8 = local_38;
    pTVar3 = (Text *)sf::String::getSize((String *)0x28ee18);
    if (pTVar3 < pTVar8) break;
    local_20 = VVar6.x;
    pVVar4 = Widget::getOrigin((Widget *)0x28ee3f);
    local_20 = local_20 + pVVar4->x;
    std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28ee64);
    VVar7 = sf::Text::findCharacterPos(this_01,CONCAT44(fVar5,in_stack_ffffffffffffffd0));
    fVar1 = ABS(local_20 - VVar7.x);
    if (fVar1 < fVar5) {
      fVar5 = fVar1;
      this_01 = local_38;
    }
    local_38 = (Text *)((long)&(local_38->super_Drawable)._vptr_Drawable + 1);
  }
  updateCaretPosition((TextBox *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  return;
}

Assistant:

void TextBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);

    style_->text_.setString(visibleString_);
    style_->text_.setPosition(style_->textPadding_.x, style_->textPadding_.y);
    size_t closestIndex = 0;
    float closestDistance = std::numeric_limits<float>::max();
    for (size_t i = 0; i <= visibleString_.getSize(); ++i) {
        float distance = fabs(mouseLocal.x + getOrigin().x - style_->text_.findCharacterPos(i).x);
        if (distance < closestDistance) {
            closestIndex = i;
            closestDistance = distance;
        }
    }
    GUI_DEBUG << "mouseLocal.x = " << mouseLocal.x << ", closest = " << closestIndex << ", " << closestDistance << "\n";
    updateCaretPosition(closestIndex + horizontalScroll_);
}